

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_arange.c
# Opt level: O2

int dwarf_get_arange_cu_header_offset
              (Dwarf_Arange arange,Dwarf_Off *cu_header_offset_returned,Dwarf_Error *error)

{
  int iVar1;
  
  if (arange == (Dwarf_Arange)0x0) {
    _dwarf_error((Dwarf_Debug)0x0,error,0x8b);
    iVar1 = 1;
  }
  else {
    if (((arange->ar_dbg->de_debug_info).dss_data == (Dwarf_Small *)0x0) &&
       (iVar1 = _dwarf_load_debug_info(arange->ar_dbg,error), iVar1 != 0)) {
      return iVar1;
    }
    *cu_header_offset_returned = arange->ar_info_offset;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int
dwarf_get_arange_cu_header_offset(Dwarf_Arange arange,
    Dwarf_Off * cu_header_offset_returned,
    Dwarf_Error * error)
{
    Dwarf_Debug dbg = 0;
    if (arange == NULL) {
        _dwarf_error(NULL, error, DW_DLE_ARANGE_NULL);
        return DW_DLV_ERROR;
    }
    dbg = arange->ar_dbg;
    /* This applies to debug_info only, not to debug_types. */
    /*  Like dwarf_get_arange_info_b() this ensures debug_info loaded:
        the cu_header is in debug_info and will be used else
        we would not call dwarf_get_arange_cu_header_offset. */
    if (!dbg->de_debug_info.dss_data) {
        int res = _dwarf_load_debug_info(dbg, error);
        if (res != DW_DLV_OK) {
            return res;
        }
    }
    *cu_header_offset_returned = arange->ar_info_offset;
    return DW_DLV_OK;
}